

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

int Gia_ManCompare(Gia_Man_t *p1,Gia_Man_t *p2)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *__s2;
  bool bVar3;
  uint local_34;
  int i;
  Gia_Obj_t *pObj2;
  Gia_Obj_t *pObj1;
  Gia_Man_t *p2_local;
  Gia_Man_t *p1_local;
  
  iVar1 = Gia_ManObjNum(p1);
  iVar2 = Gia_ManObjNum(p2);
  if (iVar1 == iVar2) {
    Gia_ManCleanValue(p1);
    Gia_ManCleanValue(p2);
    local_34 = 0;
    while( true ) {
      bVar3 = false;
      if ((int)local_34 < p1->nObjs) {
        pObj2 = Gia_ManObj(p1,local_34);
        bVar3 = pObj2 != (Gia_Obj_t *)0x0;
      }
      if (!bVar3) {
        return 1;
      }
      __s2 = Gia_ManObj(p2,local_34);
      iVar1 = memcmp(pObj2,__s2,0xc);
      if (iVar1 != 0) {
        printf("Objects %d are different.\n",(ulong)local_34);
        return 0;
      }
      if (((p1->pReprs != (Gia_Rpr_t *)0x0) && (p2->pReprs != (Gia_Rpr_t *)0x0)) &&
         (p1->pReprs[(int)local_34] != p2->pReprs[(int)local_34])) break;
      local_34 = local_34 + 1;
    }
    printf("Representatives of objects %d are different.\n",(ulong)local_34);
  }
  else {
    printf("AIGs have different number of objects.\n");
  }
  return 0;
}

Assistant:

int Gia_ManCompare( Gia_Man_t * p1, Gia_Man_t * p2 )
{
    Gia_Obj_t * pObj1, * pObj2;
    int i;
    if ( Gia_ManObjNum(p1) != Gia_ManObjNum(p2) )
    {
        printf( "AIGs have different number of objects.\n" );
        return 0;
    }
    Gia_ManCleanValue( p1 );
    Gia_ManCleanValue( p2 );
    Gia_ManForEachObj( p1, pObj1, i )
    {
        pObj2 = Gia_ManObj( p2, i );
        if ( memcmp( pObj1, pObj2, sizeof(Gia_Obj_t) ) )
        {
            printf( "Objects %d are different.\n", i );
            return 0;
        }
        if ( p1->pReprs && p2->pReprs )
        {
            if ( memcmp( &p1->pReprs[i], &p2->pReprs[i], sizeof(Gia_Rpr_t) ) )
            {
                printf( "Representatives of objects %d are different.\n", i );
                return 0;
            }
        }
    }
    return 1;
}